

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

void cmdline_parser_release(gengetopt_args_info *args_info)

{
  gengetopt_args_info *in_RDI;
  uint unaff_retaddr;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  uint uVar1;
  
  free_string_field((char **)0x140fa7);
  free_string_field((char **)0x140fb5);
  free_string_field((char **)0x140fc3);
  free_string_field((char **)0x140fd1);
  free_string_field((char **)0x140fdf);
  free_multiple_field(unaff_retaddr,in_RDI,
                      (char ***)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  in_RDI->shellRadius_arg = (double *)0x0;
  free_multiple_field(unaff_retaddr,in_RDI,
                      (char ***)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  in_RDI->molFraction_arg = (double *)0x0;
  free_string_field((char **)0x141057);
  free_string_field((char **)0x141068);
  free_string_field((char **)0x141079);
  for (uVar1 = 0; uVar1 < in_RDI->inputs_num; uVar1 = uVar1 + 1) {
    free(in_RDI->inputs[uVar1]);
  }
  if (in_RDI->inputs_num != 0) {
    free(in_RDI->inputs);
  }
  clear_given(in_RDI);
  return;
}

Assistant:

static void
cmdline_parser_release (struct gengetopt_args_info *args_info)
{
  unsigned int i;
  free_string_field (&(args_info->output_arg));
  free_string_field (&(args_info->output_orig));
  free_string_field (&(args_info->latticeConstant_orig));
  free_string_field (&(args_info->radius_orig));
  free_string_field (&(args_info->length_orig));
  free_multiple_field (args_info->shellRadius_given, (void *)(args_info->shellRadius_arg), &(args_info->shellRadius_orig));
  args_info->shellRadius_arg = 0;
  free_multiple_field (args_info->molFraction_given, (void *)(args_info->molFraction_arg), &(args_info->molFraction_orig));
  args_info->molFraction_arg = 0;
  free_string_field (&(args_info->vacancyPercent_orig));
  free_string_field (&(args_info->vacancyInnerRadius_orig));
  free_string_field (&(args_info->vacancyOuterRadius_orig));
  
  
  for (i = 0; i < args_info->inputs_num; ++i)
    free (args_info->inputs [i]);

  if (args_info->inputs_num)
    free (args_info->inputs);

  clear_given (args_info);
}